

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O1

void __thiscall cmExtraEclipseCDT4Generator::Generate(cmExtraEclipseCDT4Generator *this)

{
  string *cSubdir;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer puVar2;
  cmMakefile *this_00;
  pointer pcVar3;
  size_t __n;
  bool bVar4;
  bool bVar5;
  int iVar6;
  string *psVar7;
  uint minorVersion;
  uint majorVersion;
  string eclipseVersion;
  RegularExpression regex;
  string local_180;
  string local_160;
  string local_140;
  long *local_120 [2];
  long local_110 [2];
  undefined1 local_100 [88];
  char *local_a8;
  char *local_50;
  char *local_40;
  int local_38;
  
  puVar2 = (((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->LocalGenerators).
           super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00 = *(cmMakefile **)
             ((long)(puVar2->_M_t).
                    super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                    _M_t + 0x70);
  local_100._0_8_ = local_100 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"CMAKE_ECLIPSE_VERSION","");
  psVar7 = cmMakefile::GetSafeDefinition(this_00,(string *)local_100);
  local_120[0] = local_110;
  pcVar3 = (psVar7->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,pcVar3,pcVar3 + psVar7->_M_string_length);
  if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
    operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
  }
  local_50 = (char *)0x0;
  local_40 = (char *)0x0;
  local_38 = 0;
  memset((RegularExpression *)local_100,0,0xaa);
  cmsys::RegularExpression::compile((RegularExpression *)local_100,".*([0-9]+\\.[0-9]+).*");
  bVar4 = cmsys::RegularExpression::find
                    ((RegularExpression *)local_100,(char *)local_120[0],
                     (RegularExpressionMatch *)local_100);
  if (bVar4) {
    local_140._M_dataplus._M_p = local_140._M_dataplus._M_p & 0xffffffff00000000;
    local_160._M_dataplus._M_p = local_160._M_dataplus._M_p & 0xffffffff00000000;
    if ((char *)local_100._8_8_ == (char *)0x0) {
      local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
      local_180._M_string_length = 0;
      local_180.field_2._M_local_buf[0] = '\0';
    }
    else {
      local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,local_100._8_8_,local_a8)
      ;
    }
    iVar6 = __isoc99_sscanf(local_180._M_dataplus._M_p,"%u.%u",&local_140);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
      operator_delete(local_180._M_dataplus._M_p,
                      CONCAT71(local_180.field_2._M_allocated_capacity._1_7_,
                               local_180.field_2._M_local_buf[0]) + 1);
    }
    if (iVar6 == 2) {
      iVar6 = (int)local_140._M_dataplus._M_p * 1000 + (int)local_160._M_dataplus._M_p;
      if (iVar6 < 0xbbe) {
        this->SupportsVirtualFolders = false;
        this->SupportsMachO64Parser = false;
      }
      if (iVar6 < 0xbbf) {
        this->SupportsGmakeErrorParser = false;
      }
    }
  }
  cmLocalGenerator::GetSourceDirectory_abi_cxx11_
            ((cmLocalGenerator *)
             (puVar2->_M_t).
             super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t);
  psVar7 = &this->HomeDirectory;
  std::__cxx11::string::_M_assign((string *)psVar7);
  cmLocalGenerator::GetBinaryDirectory_abi_cxx11_
            ((cmLocalGenerator *)
             (puVar2->_M_t).
             super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t);
  cSubdir = &this->HomeOutputDirectory;
  std::__cxx11::string::_M_assign((string *)cSubdir);
  paVar1 = &local_180.field_2;
  local_180._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_180,"CMAKE_ECLIPSE_GENERATE_LINKED_RESOURCES","");
  bVar4 = cmMakefile::IsOn(this_00,&local_180);
  this->GenerateLinkedResources = bVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != paVar1) {
    operator_delete(local_180._M_dataplus._M_p,
                    CONCAT71(local_180.field_2._M_allocated_capacity._1_7_,
                             local_180.field_2._M_local_buf[0]) + 1);
  }
  __n = (this->HomeDirectory)._M_string_length;
  bVar4 = true;
  if (__n == (this->HomeOutputDirectory)._M_string_length) {
    if (__n == 0) {
      bVar4 = false;
    }
    else {
      iVar6 = bcmp((psVar7->_M_dataplus)._M_p,(cSubdir->_M_dataplus)._M_p,__n);
      bVar4 = iVar6 != 0;
    }
  }
  this->IsOutOfSourceBuild = bVar4;
  if (bVar4 == false) {
    bVar5 = false;
  }
  else {
    local_180._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_180,"CMAKE_ECLIPSE_GENERATE_SOURCE_PROJECT","");
    bVar5 = cmMakefile::IsOn(this_00,&local_180);
  }
  this->GenerateSourceProject = bVar5;
  if ((bVar4 != false) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != paVar1)) {
    operator_delete(local_180._M_dataplus._M_p,
                    CONCAT71(local_180.field_2._M_allocated_capacity._1_7_,
                             local_180.field_2._M_local_buf[0]) + 1);
  }
  if (this->GenerateSourceProject == false) {
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_140,"ECLIPSE_CDT4_GENERATE_SOURCE_PROJECT","");
    bVar4 = cmMakefile::IsOn(this_00,&local_140);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar4 = false;
  }
  if (bVar4 != false) {
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_160,
               "ECLIPSE_CDT4_GENERATE_SOURCE_PROJECT is set to TRUE, but this variable is not supported anymore since CMake 2.8.7.\nEnable CMAKE_ECLIPSE_GENERATE_SOURCE_PROJECT instead."
               ,"");
    cmMakefile::IssueMessage(this_00,WARNING,&local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
  }
  bVar4 = cmsys::SystemTools::IsSubDirectory(cSubdir,psVar7);
  if (bVar4) {
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_160,
               "The build directory is a subdirectory of the source directory.\nThis is not supported well by Eclipse. It is strongly recommended to use a build directory which is a sibling of the source directory."
               ,"");
    cmMakefile::IssueMessage(this_00,WARNING,&local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
  }
  if (this->GenerateSourceProject == true) {
    CreateSourceProjectFile(this);
  }
  CreateProjectFile(this);
  CreateCProjectFile(this);
  CreateSettingsResourcePrefsFile(this);
  if (local_40 != (char *)0x0) {
    operator_delete__(local_40);
  }
  if (local_120[0] != local_110) {
    operator_delete(local_120[0],local_110[0] + 1);
  }
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::Generate()
{
  const auto& lg = this->GlobalGenerator->GetLocalGenerators()[0];
  const cmMakefile* mf = lg->GetMakefile();

  std::string eclipseVersion = mf->GetSafeDefinition("CMAKE_ECLIPSE_VERSION");
  cmsys::RegularExpression regex(".*([0-9]+\\.[0-9]+).*");
  if (regex.find(eclipseVersion)) {
    unsigned int majorVersion = 0;
    unsigned int minorVersion = 0;
    int res =
      sscanf(regex.match(1).c_str(), "%u.%u", &majorVersion, &minorVersion);
    if (res == 2) {
      int version = majorVersion * 1000 + minorVersion;
      if (version < 3006) // 3.6 is Helios
      {
        this->SupportsVirtualFolders = false;
        this->SupportsMachO64Parser = false;
      }
      if (version < 3007) // 3.7 is Indigo
      {
        this->SupportsGmakeErrorParser = false;
      }
    }
  }

  // TODO: Decide if these are local or member variables
  this->HomeDirectory = lg->GetSourceDirectory();
  this->HomeOutputDirectory = lg->GetBinaryDirectory();

  this->GenerateLinkedResources =
    mf->IsOn("CMAKE_ECLIPSE_GENERATE_LINKED_RESOURCES");

  this->IsOutOfSourceBuild =
    (this->HomeDirectory != this->HomeOutputDirectory);

  this->GenerateSourceProject =
    (this->IsOutOfSourceBuild &&
     mf->IsOn("CMAKE_ECLIPSE_GENERATE_SOURCE_PROJECT"));

  if (!this->GenerateSourceProject &&
      (mf->IsOn("ECLIPSE_CDT4_GENERATE_SOURCE_PROJECT"))) {
    mf->IssueMessage(
      MessageType::WARNING,
      "ECLIPSE_CDT4_GENERATE_SOURCE_PROJECT is set to TRUE, "
      "but this variable is not supported anymore since CMake 2.8.7.\n"
      "Enable CMAKE_ECLIPSE_GENERATE_SOURCE_PROJECT instead.");
  }

  if (cmSystemTools::IsSubDirectory(this->HomeOutputDirectory,
                                    this->HomeDirectory)) {
    mf->IssueMessage(MessageType::WARNING,
                     "The build directory is a subdirectory "
                     "of the source directory.\n"
                     "This is not supported well by Eclipse. It is strongly "
                     "recommended to use a build directory which is a "
                     "sibling of the source directory.");
  }

  // NOTE: This is not good, since it pollutes the source tree. However,
  //       Eclipse doesn't allow CVS/SVN to work when the .project is not in
  //       the cvs/svn root directory. Hence, this is provided as an option.
  if (this->GenerateSourceProject) {
    // create .project file in the source tree
    this->CreateSourceProjectFile();
  }

  // create a .project file
  this->CreateProjectFile();

  // create a .cproject file
  this->CreateCProjectFile();

  // create resource settings
  this->CreateSettingsResourcePrefsFile();
}